

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O2

REF_STATUS ref_smooth_tri_quality_around(REF_GRID ref_grid,REF_INT node,REF_DBL *min_quality)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  undefined8 uVar5;
  REF_INT cell;
  char *pcVar6;
  ulong uVar7;
  double dVar8;
  REF_DBL quality;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  *min_quality = 1.0;
  uVar7 = 0xffffffff;
  cell = -1;
  if (-1 < node) {
    pRVar1 = ref_cell->ref_adj;
    uVar7 = 0xffffffff;
    cell = -1;
    if (node < pRVar1->nnode) {
      uVar4 = pRVar1->first[(uint)node];
      uVar7 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar4 != -1) {
        cell = pRVar1->item[(int)uVar4].ref;
        uVar7 = (ulong)uVar4;
      }
    }
  }
  bVar3 = false;
  while( true ) {
    if ((int)uVar7 == -1) {
      if (!bVar3) {
        *min_quality = -2.0;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0xb4,"ref_smooth_tri_quality_around","no triangle found, can not compute quality");
      }
      return (uint)!bVar3;
    }
    uVar4 = ref_cell_nodes(ref_cell,cell,nodes);
    if (uVar4 != 0) break;
    uVar4 = ref_node_tri_quality(ref_node,nodes,&quality);
    if (uVar4 != 0) {
      pcVar6 = "qual";
      uVar5 = 0xae;
      goto LAB_001c18c0;
    }
    dVar8 = *min_quality;
    if (quality <= *min_quality) {
      dVar8 = quality;
    }
    *min_quality = dVar8;
    pRVar2 = ref_cell->ref_adj->item;
    uVar7 = (ulong)pRVar2[(int)uVar7].next;
    bVar3 = true;
    cell = -1;
    if (uVar7 != 0xffffffffffffffff) {
      cell = pRVar2[uVar7].ref;
    }
  }
  pcVar6 = "nodes";
  uVar5 = 0xac;
LAB_001c18c0:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar5,
         "ref_smooth_tri_quality_around",(ulong)uVar4,pcVar6);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_smooth_tri_quality_around(REF_GRID ref_grid,
                                                 REF_INT node,
                                                 REF_DBL *min_quality) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL none_found = REF_TRUE;
  REF_DBL quality;

  *min_quality = 1.0;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    none_found = REF_FALSE;
    RSS(ref_node_tri_quality(ref_node, nodes, &quality), "qual");
    *min_quality = MIN(*min_quality, quality);
  }

  if (none_found) {
    *min_quality = -2.0;
    THROW("no triangle found, can not compute quality");
  }

  return REF_SUCCESS;
}